

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O2

void test_86(QPDF *pdf,char *arg2)

{
  char cVar1;
  __type_conflict1 _Var2;
  bool bVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  QPDFObjectHandle h;
  string utf8_val;
  string result;
  string utf16_val;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&utf8_val,"\x1f",(allocator<char> *)&utf16_val);
  utf16_val._M_dataplus._M_p = (pointer)&utf16_val.field_2;
  utf16_val.field_2._M_allocated_capacity._0_4_ = 0x1f00fffe;
  utf16_val._M_string_length = 4;
  utf16_val.field_2._M_local_buf[4] = '\0';
  result._M_dataplus._M_p = (pointer)&result.field_2;
  result._M_string_length = 0;
  result.field_2._M_local_buf[0] = '\0';
  cVar1 = QUtil::utf8_to_ascii((string *)&utf8_val,(string *)&result,'?');
  if (cVar1 == '\0') {
    __assert_fail("QUtil::utf8_to_ascii(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc15,"void test_86(QPDF &, const char *)");
  }
  _Var2 = std::operator==(&result,&utf8_val);
  if (!_Var2) {
    __assert_fail("result == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc16,"void test_86(QPDF &, const char *)");
  }
  cVar1 = QUtil::utf8_to_pdf_doc((string *)&utf8_val,(string *)&result,'?');
  if (cVar1 != '\0') {
    __assert_fail("!QUtil::utf8_to_pdf_doc(utf8_val, result, \'?\')",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc17,"void test_86(QPDF &, const char *)");
  }
  bVar3 = std::operator==(&result,"?");
  if (!bVar3) {
    __assert_fail("result == \"?\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc18,"void test_86(QPDF &, const char *)");
  }
  QUtil::utf8_to_utf16((string *)&bStack_98);
  _Var2 = std::operator==(&bStack_98,&utf16_val);
  if (!_Var2) {
    __assert_fail("QUtil::utf8_to_utf16(utf8_val) == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc19,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_98);
  QUtil::utf16_to_utf8((string *)&bStack_98);
  _Var2 = std::operator==(&bStack_98,&utf8_val);
  if (!_Var2) {
    __assert_fail("QUtil::utf16_to_utf8(utf16_val) == utf8_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1a,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_98);
  QPDFObjectHandle::newUnicodeString((string *)&h);
  QPDFObjectHandle::getStringValue_abi_cxx11_();
  _Var2 = std::operator==(&bStack_98,&utf16_val);
  if (!_Var2) {
    __assert_fail("h.getStringValue() == utf16_val",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                  ,0xc1c,"void test_86(QPDF &, const char *)");
  }
  std::__cxx11::string::~string((string *)&bStack_98);
  QPDFObjectHandle::getUTF8Value_abi_cxx11_();
  _Var2 = std::operator==(&bStack_98,&utf8_val);
  if (_Var2) {
    std::__cxx11::string::~string((string *)&bStack_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&h.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&result);
    std::__cxx11::string::~string((string *)&utf16_val);
    std::__cxx11::string::~string((string *)&utf8_val);
    return;
  }
  __assert_fail("h.getUTF8Value() == utf8_val",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/qpdf/test_driver.cc"
                ,0xc1d,"void test_86(QPDF &, const char *)");
}

Assistant:

static void
test_86(QPDF& pdf, char const* arg2)
{
    // Test symmetry between newUnicodeString and getUTF8Value for
    // strings that can't be encoded as PDFDoc but don't contain any
    // high code points.

    std::string utf8_val("\x1f");
    std::string utf16_val("\xfe\xff\x00\x1f", 4);
    std::string result;
    assert(QUtil::utf8_to_ascii(utf8_val, result, '?'));
    assert(result == utf8_val);
    assert(!QUtil::utf8_to_pdf_doc(utf8_val, result, '?'));
    assert(result == "?");
    assert(QUtil::utf8_to_utf16(utf8_val) == utf16_val);
    assert(QUtil::utf16_to_utf8(utf16_val) == utf8_val);
    auto h = QPDFObjectHandle::newUnicodeString(utf8_val);
    assert(h.getStringValue() == utf16_val);
    assert(h.getUTF8Value() == utf8_val);
}